

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

Nf_Man_t * Nf_StoCreate(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  int iVar1;
  abctime aVar2;
  Nf_Obj_t *pNVar3;
  Vec_Int_t *vRefs;
  Mio_Library_t *pLib;
  Nf_Mat_t *pNVar4;
  int local_34;
  int Entry;
  int i;
  Nf_Man_t *p;
  Vec_Int_t *vFlowRefs;
  Jf_Par_t *pPars_local;
  Gia_Man_t *pGia_local;
  
  if ((pPars->nCutNum < 2) || (0x20 < pPars->nCutNum)) {
    __assert_fail("pPars->nCutNum > 1 && pPars->nCutNum <= NF_CUT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x174,"Nf_Man_t *Nf_StoCreate(Gia_Man_t *, Jf_Par_t *)");
  }
  if ((1 < pPars->nLutSize) && (pPars->nLutSize < 7)) {
    if (pGia->pRefs != (int *)0x0) {
      free(pGia->pRefs);
      pGia->pRefs = (int *)0x0;
    }
    Vec_IntFreeP(&pGia->vCellMapping);
    iVar1 = Gia_ManHasChoices(pGia);
    if (iVar1 != 0) {
      Gia_ManSetPhase(pGia);
    }
    pGia_local = (Gia_Man_t *)calloc(1,0x120);
    aVar2 = Abc_Clock();
    *(abctime *)&pGia_local->nTerLoop = aVar2;
    pGia_local->pName = (char *)pGia;
    pGia_local->pSpec = (char *)pPars;
    iVar1 = Gia_ManObjNum(pGia);
    pNVar3 = (Nf_Obj_t *)calloc((long)iVar1,0x40);
    *(Nf_Obj_t **)&pGia_local->nXors = pNVar3;
    *(int *)&pGia_local->pReprsOld = 2;
    Vec_PtrGrow((Vec_Ptr_t *)&pGia_local->nBufs,0x100);
    iVar1 = Gia_ManObjNum(pGia);
    Vec_IntFill((Vec_Int_t *)&(pGia_local->vHash).pArray,iVar1 << 1,0);
    iVar1 = Gia_ManObjNum(pGia);
    Vec_FltFill((Vec_Flt_t *)&(pGia_local->vHTable).pArray,iVar1 << 1,0.0);
    iVar1 = Gia_ManObjNum(pGia);
    Vec_IntFill((Vec_Int_t *)&pGia_local->fGiaSimple,iVar1 << 1,0x3fffffff);
    iVar1 = Gia_ManObjNum(pGia);
    Vec_IntFill((Vec_Int_t *)&pGia_local->vCos,iVar1,0);
    iVar1 = Gia_ManObjNum(pGia);
    Vec_FltFill((Vec_Flt_t *)&(pGia_local->vRefs).pArray,iVar1,0.0);
    iVar1 = Gia_ManObjNum(pGia);
    Vec_IntFill((Vec_Int_t *)&pGia_local->pLutRefs,iVar1,0);
    Vec_IntGrow((Vec_Int_t *)&pGia_local->nLevels,1000);
    vRefs = Vec_IntAlloc(0);
    Mf_ManSetFlowRefs(pGia,vRefs);
    for (local_34 = 0; iVar1 = Vec_IntSize(vRefs), local_34 < iVar1; local_34 = local_34 + 1) {
      iVar1 = Vec_IntEntry(vRefs,local_34);
      Vec_FltWriteEntry((Vec_Flt_t *)&(pGia_local->vHTable).pArray,local_34 << 1,(float)iVar1);
      Vec_FltWriteEntry((Vec_Flt_t *)&(pGia_local->vHTable).pArray,local_34 * 2 + 1,(float)iVar1);
    }
    Vec_IntFree(vRefs);
    pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    Mio_LibraryMatchesFetch
              (pLib,(Vec_Mem_t **)&pGia_local->nRegs,(Vec_Wec_t **)&pGia_local->nObjs,
               (Mio_Cell2_t **)&pGia_local->pObjs,(int *)&pGia_local->pMuxes,
               ((Jf_Par_t *)pGia_local->pSpec)->fPinFilter,((Jf_Par_t *)pGia_local->pSpec)->fPinPerm
               ,((Jf_Par_t *)pGia_local->pSpec)->fPinQuick);
    if ((Mio_Cell2_t *)pGia_local->pObjs == (Mio_Cell2_t *)0x0) {
      pGia_local = (Gia_Man_t *)0x0;
    }
    else {
      *(int *)&pGia_local->pNexts = ((Mio_Cell2_t *)pGia_local->pObjs)[3].iDelays[0];
      pGia_local->pSibls = (int *)((Mio_Cell2_t *)pGia_local->pObjs)[3].AreaW;
      *(float *)&pGia_local->pIso = ((Mio_Cell2_t *)pGia_local->pObjs)[3].AreaF;
      pNVar4 = Nf_ObjMatchD((Nf_Man_t *)pGia_local,0,0);
      *(uint *)pNVar4 = *(uint *)pNVar4 & 0xfff00000;
      pNVar4 = Nf_ObjMatchD((Nf_Man_t *)pGia_local,0,1);
      *(uint *)pNVar4 = *(uint *)pNVar4 & 0xfff00000 | 1;
    }
    return (Nf_Man_t *)pGia_local;
  }
  __assert_fail("pPars->nLutSize > 1 && pPars->nLutSize <= NF_LEAF_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                ,0x175,"Nf_Man_t *Nf_StoCreate(Gia_Man_t *, Jf_Par_t *)");
}

Assistant:

Nf_Man_t * Nf_StoCreate( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    extern void Mf_ManSetFlowRefs( Gia_Man_t * p, Vec_Int_t * vRefs );
    Vec_Int_t * vFlowRefs;
    Nf_Man_t * p;
    int i, Entry;
    assert( pPars->nCutNum > 1  && pPars->nCutNum <= NF_CUT_MAX );
    assert( pPars->nLutSize > 1 && pPars->nLutSize <= NF_LEAF_MAX );
    ABC_FREE( pGia->pRefs );
    Vec_IntFreeP( &pGia->vCellMapping );
    if ( Gia_ManHasChoices(pGia) )
        Gia_ManSetPhase(pGia);
    // create
    p = ABC_CALLOC( Nf_Man_t, 1 );
    p->clkStart = Abc_Clock();
    p->pGia     = pGia;
    p->pPars    = pPars;
    p->pNfObjs  = ABC_CALLOC( Nf_Obj_t, Gia_ManObjNum(pGia) );
    p->iCur     = 2;
    // other
    Vec_PtrGrow( &p->vPages, 256 );                                    // cut memory
    Vec_IntFill( &p->vMapRefs,  2*Gia_ManObjNum(pGia), 0 );            // mapping refs   (2x)
    Vec_FltFill( &p->vFlowRefs, 2*Gia_ManObjNum(pGia), 0 );            // flow refs      (2x)
    Vec_IntFill( &p->vRequired, 2*Gia_ManObjNum(pGia), SCL_INFINITY ); // required times (2x)
    Vec_IntFill( &p->vCutSets,  Gia_ManObjNum(pGia), 0 );              // cut offsets
    Vec_FltFill( &p->vCutFlows, Gia_ManObjNum(pGia), 0 );              // cut area
    Vec_IntFill( &p->vCutDelays,Gia_ManObjNum(pGia), 0 );              // cut delay
    Vec_IntGrow( &p->vBackup, 1000 );
    // references
    vFlowRefs = Vec_IntAlloc(0);
    Mf_ManSetFlowRefs( pGia, vFlowRefs );
    Vec_IntForEachEntry( vFlowRefs, Entry, i )
    {
        Vec_FltWriteEntry( &p->vFlowRefs, 2*i,   /*0.5* */Entry );
        Vec_FltWriteEntry( &p->vFlowRefs, 2*i+1, /*0.5* */Entry );
    }
    Vec_IntFree(vFlowRefs);
    // matching
    Mio_LibraryMatchesFetch( (Mio_Library_t *)Abc_FrameReadLibGen(), &p->vTtMem, &p->vTt2Match, &p->pCells, &p->nCells, p->pPars->fPinFilter, p->pPars->fPinPerm, p->pPars->fPinQuick );
    if ( p->pCells == NULL )
        return NULL;
    p->InvDelayI = p->pCells[3].iDelays[0];
    p->InvAreaW  = p->pCells[3].AreaW;
    p->InvAreaF  = p->pCells[3].AreaF;
    Nf_ObjMatchD(p, 0, 0)->Gate = 0;
    Nf_ObjMatchD(p, 0, 1)->Gate = 1;
    // prepare cuts
    return p;
}